

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O1

char * checkInterfacePropertyCompatibility<char_const*>
                 (cmGeneratorTarget *tgt,string *p,string *config,char *defaultValue,
                 CompatibleType t,char **param_6)

{
  pointer pcVar1;
  cmGeneratorTarget *pcVar2;
  pointer pbVar3;
  int iVar4;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var5;
  vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_> *pvVar6;
  size_t sVar7;
  cmLocalGenerator *pcVar8;
  char *pcVar9;
  ostream *poVar10;
  char *pcVar11;
  bool bVar12;
  pair<bool,_const_char_*> pVar13;
  unique_ptr<cmGeneratorExpressionInterpreter,_std::default_delete<cmGeneratorExpressionInterpreter>_>
  genexInterpreter;
  string reportEntry;
  string report;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  propKeys;
  ostringstream e;
  string interfaceProperty;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  headPropKeys;
  char *local_2e8;
  cmLocalGenerator *local_2e0;
  string local_2d8;
  cmGeneratorTarget *local_2b8;
  string local_2b0;
  cmLocalGenerator *local_290;
  string local_288;
  cmLocalGenerator *local_268;
  _Base_ptr local_260;
  _Base_ptr local_258;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_250;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_248;
  char *local_240;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_238;
  string local_220;
  undefined1 local_200 [112];
  ios_base local_190 [264];
  string local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  local_2e8 = cmGeneratorTarget::GetProperty(tgt,p);
  cmGeneratorTarget::GetPropertyKeys_abi_cxx11_(&local_48,tgt);
  _Var5 = std::
          __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                    (local_48.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     local_48.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish,p);
  bVar12 = _Var5._M_current !=
           local_48.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_258 = (_Base_ptr)
              std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::find(&(tgt->LinkImplicitNullProperties)._M_t,p);
  local_250 = local_48.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  local_260 = &(tgt->LinkImplicitNullProperties)._M_t._M_impl.super__Rb_tree_header._M_header;
  local_248 = _Var5._M_current;
  if (local_258 != local_260 &&
      _Var5._M_current !=
      local_48.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    __assert_fail("(impliedByUse ^ explicitlySet) || (!impliedByUse && !explicitlySet)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmGeneratorTarget.cxx"
                  ,0x11f0,
                  "PropertyType checkInterfacePropertyCompatibility(const cmGeneratorTarget *, const std::string &, const std::string &, const char *, CompatibleType, PropertyType *) [PropertyType = const char *]"
                 );
  }
  local_2b8 = tgt;
  pvVar6 = cmGeneratorTarget::GetLinkImplementationClosure(tgt,config);
  if ((pvVar6->
      super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>).
      _M_impl.super__Vector_impl_data._M_start !=
      (pvVar6->
      super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>).
      _M_impl.super__Vector_impl_data._M_finish) {
    local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_288," * Target \"","");
    std::__cxx11::string::_M_append
              ((char *)&local_288,(ulong)(local_2b8->Target->Name)._M_dataplus._M_p);
    if (local_248 != local_250) {
      std::__cxx11::string::append((char *)&local_288);
      pcVar9 = "(unset)";
      if (local_2e8 != (char *)0x0) {
        pcVar9 = local_2e8;
      }
      local_200._0_8_ = local_200 + 0x10;
      sVar7 = strlen(pcVar9);
      std::__cxx11::string::_M_construct<char_const*>((string *)local_200,pcVar9,pcVar9 + sVar7);
      std::__cxx11::string::_M_append((char *)&local_288,local_200._0_8_);
      if ((undefined1 *)local_200._0_8_ != local_200 + 0x10) {
        operator_delete((void *)local_200._0_8_,local_200._16_8_ + 1);
      }
    }
    std::__cxx11::string::append((char *)&local_288);
    local_240 = defaultValue;
    std::operator+(&local_68,"INTERFACE_",p);
    iVar4 = std::__cxx11::string::compare((char *)p);
    if (iVar4 == 0) {
      local_290 = (cmLocalGenerator *)operator_new(0x68);
      pcVar2 = local_2b8;
      local_268 = local_2b8->LocalGenerator;
      local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
      pcVar1 = (config->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_220,pcVar1,pcVar1 + config->_M_string_length);
      pcVar8 = local_290;
      local_88._M_string_length = 0;
      local_88.field_2._M_local_buf[0] = '\0';
      local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
      cmGeneratorExpressionInterpreter::cmGeneratorExpressionInterpreter
                ((cmGeneratorExpressionInterpreter *)local_290,local_268,&local_220,pcVar2,&local_88
                );
      local_2e0 = pcVar8;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != &local_88.field_2) {
        operator_delete(local_88._M_dataplus._M_p,
                        CONCAT71(local_88.field_2._M_allocated_capacity._1_7_,
                                 local_88.field_2._M_local_buf[0]) + 1);
      }
    }
    else {
      local_2e0 = (cmLocalGenerator *)0x0;
    }
    if ((iVar4 == 0) &&
       ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_220._M_dataplus._M_p != &local_220.field_2)) {
      operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
    }
    pcVar8 = (cmLocalGenerator *)
             (pvVar6->
             super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
             )._M_impl.super__Vector_impl_data._M_start;
    local_268 = (cmLocalGenerator *)
                (pvVar6->
                super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
                )._M_impl.super__Vector_impl_data._M_finish;
    if (pcVar8 != local_268) {
      do {
        pcVar2 = (cmGeneratorTarget *)
                 (((cmGeneratorExpression *)&pcVar8->_vptr_cmLocalGenerator)->Backtrace).TopEntry.
                 super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
        local_290 = pcVar8;
        cmGeneratorTarget::GetPropertyKeys_abi_cxx11_(&local_238,pcVar2);
        _Var5 = std::
                __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                          (local_238.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start,
                           local_238.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish,&local_68);
        pbVar3 = local_238.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        pcVar9 = getTypedProperty<char_const*>
                           (pcVar2,&local_68,(cmGeneratorExpressionInterpreter *)local_2e0);
        local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
        local_2d8._M_string_length = 0;
        local_2d8.field_2._M_local_buf[0] = '\0';
        if (_Var5._M_current != pbVar3) {
          std::__cxx11::string::append((char *)&local_2d8);
          std::__cxx11::string::_M_append
                    ((char *)&local_2d8,(ulong)(pcVar2->Target->Name)._M_dataplus._M_p);
          std::__cxx11::string::append((char *)&local_2d8);
          pcVar11 = pcVar9;
          if (pcVar9 == (char *)0x0) {
            pcVar11 = "(unset)";
          }
          local_200._0_8_ = local_200 + 0x10;
          sVar7 = strlen(pcVar11);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_200,pcVar11,pcVar11 + sVar7);
          std::__cxx11::string::_M_append((char *)&local_2d8,local_200._0_8_);
          if ((undefined1 *)local_200._0_8_ != local_200 + 0x10) {
            operator_delete((void *)local_200._0_8_,local_200._16_8_ + 1);
          }
          std::__cxx11::string::append((char *)&local_2d8);
        }
        pcVar11 = local_2e8;
        if (local_248 == local_250) {
          if (local_258 == local_260) {
            if (_Var5._M_current != pbVar3) {
              if (!bVar12) {
                local_200._0_8_ = local_200 + 0x10;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)local_200,local_2d8._M_dataplus._M_p,
                           local_2d8._M_dataplus._M_p + local_2d8._M_string_length);
                std::__cxx11::string::append((char *)local_200);
                std::__cxx11::string::_M_append((char *)&local_288,local_200._0_8_);
                if ((undefined1 *)local_200._0_8_ != local_200 + 0x10) {
                  operator_delete((void *)local_200._0_8_,local_200._16_8_ + 1);
                }
                iVar4 = 0;
                bVar12 = true;
                local_2e8 = pcVar9;
                goto LAB_002d6eb8;
              }
              pVar13 = consistentProperty<char_const*>(local_2e8,pcVar9,t);
              std::__cxx11::string::_M_append((char *)&local_288,(ulong)local_2d8._M_dataplus._M_p);
              compatibilityAgree_abi_cxx11_((string *)local_200,t,local_2e8 != pVar13.second);
              std::__cxx11::string::_M_append((char *)&local_288,local_200._0_8_);
              if ((undefined1 *)local_200._0_8_ != local_200 + 0x10) {
                operator_delete((void *)local_200._0_8_,local_200._16_8_ + 1);
              }
              pcVar11 = pVar13.second;
              if (((undefined1  [16])pVar13 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
                std::__cxx11::ostringstream::ostringstream((ostringstream *)local_200);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_200,"The INTERFACE_",0xe);
                poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_200,(p->_M_dataplus)._M_p,p->_M_string_length)
                ;
                std::__ostream_insert<char,std::char_traits<char>>(poVar10," property of \"",0xe);
                poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                    (poVar10,(pcVar2->Target->Name)._M_dataplus._M_p,
                                     (pcVar2->Target->Name)._M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar10,"\" does\nnot agree with the value of ",0x23);
                poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                    (poVar10,(p->_M_dataplus)._M_p,p->_M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar10," already determined\nfor \"",0x19);
                poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                    (poVar10,(local_2b8->Target->Name)._M_dataplus._M_p,
                                     (local_2b8->Target->Name)._M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\".\n",3);
                std::__cxx11::stringbuf::str();
                cmSystemTools::Error(&local_2b0);
                goto LAB_002d6cbd;
              }
            }
            goto LAB_002d6eb3;
          }
          if (_Var5._M_current == pbVar3) {
            local_2e8 = "";
            pcVar11 = local_2e8;
            goto LAB_002d6eb3;
          }
          pVar13 = consistentProperty<char_const*>("",pcVar9,t);
          std::__cxx11::string::_M_append((char *)&local_288,(ulong)local_2d8._M_dataplus._M_p);
          compatibilityAgree_abi_cxx11_((string *)local_200,t,pVar13.second != "");
          std::__cxx11::string::_M_append((char *)&local_288,local_200._0_8_);
          if ((undefined1 *)local_200._0_8_ != local_200 + 0x10) {
            operator_delete((void *)local_200._0_8_,local_200._16_8_ + 1);
          }
          pcVar11 = pVar13.second;
          if (((undefined1  [16])pVar13 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
          goto LAB_002d6eb3;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_200);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_200,"Property ",9);
          poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_200,(p->_M_dataplus)._M_p,p->_M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar10," on target \"",0xc);
          poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                              (poVar10,(local_2b8->Target->Name)._M_dataplus._M_p,
                               (local_2b8->Target->Name)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\" is\nimplied to be ",0x13);
          pcVar9 = local_240;
          if (local_240 == (char *)0x0) {
            std::ios::clear((int)poVar10 + (int)poVar10->_vptr_basic_ostream[-3]);
          }
          else {
            sVar7 = strlen(local_240);
            std::__ostream_insert<char,std::char_traits<char>>(poVar10,pcVar9,sVar7);
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar10,
                     " because it was used to determine the link libraries\nalready. The INTERFACE_"
                     ,0x4c);
          poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                              (poVar10,(p->_M_dataplus)._M_p,p->_M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar10," property on\ndependency \"",0x19);
          poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                              (poVar10,(pcVar2->Target->Name)._M_dataplus._M_p,
                               (pcVar2->Target->Name)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\" is in conflict.\n",0x12);
          std::__cxx11::stringbuf::str();
          cmSystemTools::Error(&local_2b0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
            operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_200);
          std::ios_base::~ios_base(local_190);
          iVar4 = 2;
          local_2e8 = "";
        }
        else {
          if (_Var5._M_current != pbVar3) {
            pVar13 = consistentProperty<char_const*>(local_2e8,pcVar9,t);
            std::__cxx11::string::_M_append((char *)&local_288,(ulong)local_2d8._M_dataplus._M_p);
            compatibilityAgree_abi_cxx11_((string *)local_200,t,local_2e8 != pVar13.second);
            std::__cxx11::string::_M_append((char *)&local_288,local_200._0_8_);
            if ((undefined1 *)local_200._0_8_ != local_200 + 0x10) {
              operator_delete((void *)local_200._0_8_,local_200._16_8_ + 1);
            }
            pcVar11 = pVar13.second;
            if (((undefined1  [16])pVar13 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_200);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_200,"Property ",9)
              ;
              poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_200,(p->_M_dataplus)._M_p,p->_M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar10," on target \"",0xc);
              poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar10,(local_2b8->Target->Name)._M_dataplus._M_p,
                                   (local_2b8->Target->Name)._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar10,"\" does\nnot match the INTERFACE_",0x1f);
              poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar10,(p->_M_dataplus)._M_p,p->_M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar10," property requirement\nof dependency \"",0x25);
              poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar10,(pcVar2->Target->Name)._M_dataplus._M_p,
                                   (pcVar2->Target->Name)._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\".\n",3);
              std::__cxx11::stringbuf::str();
              cmSystemTools::Error(&local_2b0);
LAB_002d6cbd:
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
                operator_delete(local_2b0._M_dataplus._M_p,
                                local_2b0.field_2._M_allocated_capacity + 1);
              }
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_200);
              std::ios_base::~ios_base(local_190);
              iVar4 = 2;
              goto LAB_002d6eb8;
            }
          }
LAB_002d6eb3:
          local_2e8 = pcVar11;
          iVar4 = 3;
        }
LAB_002d6eb8:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
          operator_delete(local_2d8._M_dataplus._M_p,
                          CONCAT71(local_2d8.field_2._M_allocated_capacity._1_7_,
                                   local_2d8.field_2._M_local_buf[0]) + 1);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_238);
      } while (((iVar4 == 3) || (iVar4 == 0)) &&
              (pcVar8 = (cmLocalGenerator *)&local_290->super_cmOutputConverter, pcVar8 != local_268
              ));
    }
    pcVar9 = "(unset)";
    if (local_2e8 != (char *)0x0) {
      pcVar9 = local_2e8;
    }
    local_200._0_8_ = local_200 + 0x10;
    sVar7 = strlen(pcVar9);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_200,pcVar9,pcVar9 + sVar7);
    compatibilityType_abi_cxx11_(&local_2d8,t);
    cmGeneratorTarget::ReportPropertyOrigin(local_2b8,p,(string *)local_200,&local_288,&local_2d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
      operator_delete(local_2d8._M_dataplus._M_p,
                      CONCAT71(local_2d8.field_2._M_allocated_capacity._1_7_,
                               local_2d8.field_2._M_local_buf[0]) + 1);
    }
    if ((undefined1 *)local_200._0_8_ != local_200 + 0x10) {
      operator_delete((void *)local_200._0_8_,local_200._16_8_ + 1);
    }
    if (local_2e0 != (cmLocalGenerator *)0x0) {
      std::default_delete<cmGeneratorExpressionInterpreter>::operator()
                ((default_delete<cmGeneratorExpressionInterpreter> *)&local_2e0,
                 (cmGeneratorExpressionInterpreter *)local_2e0);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_288._M_dataplus._M_p != &local_288.field_2) {
      operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_48);
  return local_2e8;
}

Assistant:

PropertyType checkInterfacePropertyCompatibility(cmGeneratorTarget const* tgt,
                                                 const std::string& p,
                                                 const std::string& config,
                                                 const char* defaultValue,
                                                 CompatibleType t,
                                                 PropertyType* /*unused*/)
{
  PropertyType propContent = getTypedProperty<PropertyType>(tgt, p);

  std::vector<std::string> headPropKeys = tgt->GetPropertyKeys();
  const bool explicitlySet =
    std::find(headPropKeys.begin(), headPropKeys.end(), p) !=
    headPropKeys.end();

  const bool impliedByUse = tgt->IsNullImpliedByLinkLibraries(p);
  assert((impliedByUse ^ explicitlySet) || (!impliedByUse && !explicitlySet));

  std::vector<cmGeneratorTarget const*> const& deps =
    tgt->GetLinkImplementationClosure(config);

  if (deps.empty()) {
    return propContent;
  }
  bool propInitialized = explicitlySet;

  std::string report = " * Target \"";
  report += tgt->GetName();
  if (explicitlySet) {
    report += "\" has property content \"";
    report += valueAsString<PropertyType>(propContent);
    report += "\"\n";
  } else if (impliedByUse) {
    report += "\" property is implied by use.\n";
  } else {
    report += "\" property not set.\n";
  }

  std::string interfaceProperty = "INTERFACE_" + p;
  std::unique_ptr<cmGeneratorExpressionInterpreter> genexInterpreter(
    p == "POSITION_INDEPENDENT_CODE" ? new cmGeneratorExpressionInterpreter(
                                         tgt->GetLocalGenerator(), config, tgt)
                                     : nullptr);

  for (cmGeneratorTarget const* theTarget : deps) {
    // An error should be reported if one dependency
    // has INTERFACE_POSITION_INDEPENDENT_CODE ON and the other
    // has INTERFACE_POSITION_INDEPENDENT_CODE OFF, or if the
    // target itself has a POSITION_INDEPENDENT_CODE which disagrees
    // with a dependency.

    std::vector<std::string> propKeys = theTarget->GetPropertyKeys();

    const bool ifaceIsSet = std::find(propKeys.begin(), propKeys.end(),
                                      interfaceProperty) != propKeys.end();
    PropertyType ifacePropContent = getTypedProperty<PropertyType>(
      theTarget, interfaceProperty, genexInterpreter.get());

    std::string reportEntry;
    if (ifaceIsSet) {
      reportEntry += " * Target \"";
      reportEntry += theTarget->GetName();
      reportEntry += "\" property value \"";
      reportEntry += valueAsString<PropertyType>(ifacePropContent);
      reportEntry += "\" ";
    }

    if (explicitlySet) {
      if (ifaceIsSet) {
        std::pair<bool, PropertyType> consistent =
          consistentProperty(propContent, ifacePropContent, t);
        report += reportEntry;
        report += compatibilityAgree(t, propContent != consistent.second);
        if (!consistent.first) {
          std::ostringstream e;
          e << "Property " << p << " on target \"" << tgt->GetName()
            << "\" does\nnot match the "
               "INTERFACE_"
            << p
            << " property requirement\nof "
               "dependency \""
            << theTarget->GetName() << "\".\n";
          cmSystemTools::Error(e.str());
          break;
        }
        propContent = consistent.second;
        continue;
      }
      // Explicitly set on target and not set in iface. Can't disagree.
      continue;
    }
    if (impliedByUse) {
      propContent = impliedValue<PropertyType>(propContent);

      if (ifaceIsSet) {
        std::pair<bool, PropertyType> consistent =
          consistentProperty(propContent, ifacePropContent, t);
        report += reportEntry;
        report += compatibilityAgree(t, propContent != consistent.second);
        if (!consistent.first) {
          std::ostringstream e;
          e << "Property " << p << " on target \"" << tgt->GetName()
            << "\" is\nimplied to be " << defaultValue
            << " because it was used to determine the link libraries\n"
               "already. The INTERFACE_"
            << p << " property on\ndependency \"" << theTarget->GetName()
            << "\" is in conflict.\n";
          cmSystemTools::Error(e.str());
          break;
        }
        propContent = consistent.second;
        continue;
      }
      // Implicitly set on target and not set in iface. Can't disagree.
      continue;
    }
    if (ifaceIsSet) {
      if (propInitialized) {
        std::pair<bool, PropertyType> consistent =
          consistentProperty(propContent, ifacePropContent, t);
        report += reportEntry;
        report += compatibilityAgree(t, propContent != consistent.second);
        if (!consistent.first) {
          std::ostringstream e;
          e << "The INTERFACE_" << p << " property of \""
            << theTarget->GetName() << "\" does\nnot agree with the value of "
            << p << " already determined\nfor \"" << tgt->GetName() << "\".\n";
          cmSystemTools::Error(e.str());
          break;
        }
        propContent = consistent.second;
        continue;
      }
      report += reportEntry + "(Interface set)\n";
      propContent = ifacePropContent;
      propInitialized = true;
    } else {
      // Not set. Nothing to agree on.
      continue;
    }
  }

  tgt->ReportPropertyOrigin(p, valueAsString<PropertyType>(propContent),
                            report, compatibilityType(t));
  return propContent;
}